

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O3

void __thiscall
CorUnix::CSynchData::Signal
          (CSynchData *this,CPalThread *pthrCurrent,LONG lSignalCount,bool fWorkerThread)

{
  ThreadReleaseSemantics TVar1;
  uint uVar2;
  FILE *__stream;
  bool bVar3;
  LONG LVar4;
  uint uVar5;
  ulong in_RAX;
  undefined8 uStack_38;
  bool fDelegatedSignaling;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  if (lSignalCount < 0) {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x3f1);
    fprintf(_stderr,"Expression: 0 <= lSignalCount\n");
    this->m_lSignalCount = lSignalCount;
  }
  else {
    TVar1 = CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eThreadReleaseSemantics;
    this->m_lSignalCount = lSignalCount;
    if (lSignalCount != 0) {
      do {
        bVar3 = ReleaseFirstWaiter(this,pthrCurrent,(bool *)((long)&uStack_38 + 7),fWorkerThread);
        if (!bVar3) break;
        if (TVar1 == ThreadReleaseAltersSignalCount) {
          this->m_lSignalCount = this->m_lSignalCount + -1;
        }
        if (uStack_38._7_1_ == '\x01') {
          this->m_lSignalCount = 0;
          break;
        }
      } while (0 < this->m_lSignalCount);
    }
  }
  if (((CObjectType::s_rgotIdMapping[this->m_otiObjectTypeId]->m_eOwnershipSemantics ==
        OwnershipTracked) && (this->m_lOwnershipCount != 0)) &&
     (LVar4 = GetSignalCount(this), LVar4 != 0)) {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x413);
    __stream = _stderr;
    uVar2 = this->m_lOwnershipCount;
    uVar5 = GetSignalCount(this);
    fprintf(__stream,
            "Expression: CObjectType::OwnershipTracked != GetObjectType()->GetOwnershipSemantics() || 0 == GetOwnershipCount() || 0 == GetSignalCount(), Description: Conflicting values for SignalCount [%d] and OwnershipCount [%d]\n"
            ,(ulong)uVar2,(ulong)uVar5);
  }
  if ((this->m_otiObjectTypeId == otiMutex) && (1 < this->m_lSignalCount)) {
    fprintf(_stderr,"] %s %s:%d","Signal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x416);
    fprintf(_stderr,
            "Expression: otiMutex != m_otiObjectTypeId || m_lSignalCount <= 1, Description: Mutex with invalid singal count\n"
           );
    return;
  }
  return;
}

Assistant:

void CSynchData::Signal(
        CPalThread * pthrCurrent, 
        LONG lSignalCount, 
        bool fWorkerThread)
    {
        VALIDATEOBJECT(this);

        bool fThreadReleased = false;
        bool fDelegatedSignaling = false;
        bool fReleaseAltersSignalCount = 
            (CObjectType::ThreadReleaseAltersSignalCount ==
                GetObjectType()->GetThreadReleaseSemantics());

        _ASSERTE(0 <= lSignalCount);

        // Preset the signal count to the new value, so that it can be used
        // by ReleaseFirstWaiter when delegating signaling to another process
        m_lSignalCount = lSignalCount;
        
        while (m_lSignalCount > 0)
        {
            fThreadReleased = ReleaseFirstWaiter(pthrCurrent, 
                                                 &fDelegatedSignaling, 
                                                 fWorkerThread);
            if (!fThreadReleased)
            {
                // No more threads to release: break out of the loop
                // keeping the current signal count
                break;
            }
            if (fReleaseAltersSignalCount)
            {
                // Adjust signal count
                m_lSignalCount--;
            }
            if (fDelegatedSignaling)
            {
                // Object signaling has been delegated
                m_lSignalCount = 0;
            }                    
        }
        
        _ASSERT_MSG(CObjectType::OwnershipTracked != 
                    GetObjectType()->GetOwnershipSemantics() || 
                    0 == GetOwnershipCount() || 0 == GetSignalCount(),
                    "Conflicting values for SignalCount [%d] and "
                    "OwnershipCount [%d]\n", 
                    GetOwnershipCount(), GetSignalCount());

        _ASSERT_MSG(otiMutex != m_otiObjectTypeId || m_lSignalCount <= 1,
                    "Mutex with invalid singal count\n");

        return;
    }